

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[18],unsigned_int&,char_const(&)[46]>
          (String *__return_storage_ptr__,kj *this,char (*params) [18],uint *params_1,
          char (*params_2) [46])

{
  undefined1 local_60 [24];
  size_t local_48;
  CappedArray<char,_14UL> local_40;
  
  local_48 = strlen((char *)this);
  local_60._16_8_ = this;
  _::Stringifier::operator*(&local_40,(Stringifier *)&_::STR,*(uint *)*params);
  local_60._8_8_ = strlen((char *)params_1);
  local_60._0_8_ = params_1;
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)(local_60 + 0x10),(ArrayPtr<const_char> *)&local_40,
             (CappedArray<char,_14UL> *)local_60,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}